

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

void duckdb::ColumnDataCopy<duckdb::hugeint_t>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ushort uVar1;
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  undefined8 uVar5;
  bool bVar6;
  hugeint_t *source_data_1;
  reference pvVar7;
  ColumnDataAllocator *this_00;
  data_ptr_t pdVar8;
  idx_t iVar9;
  long lVar10;
  idx_t iVar11;
  ulong uVar12;
  VectorDataIndex prev_index;
  hugeint_t *result_data;
  ulong uVar13;
  ValidityMask result_validity;
  idx_t local_a0;
  TemplatedValidityMask<unsigned_long> local_50;
  
  this = meta_data->segment;
  state = meta_data->state;
  prev_index.index = (meta_data->vector_data_index).index;
  local_a0 = offset;
  while (copy_count != 0) {
    pvVar7 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
    uVar13 = (ulong)(0x800 - pvVar7->count);
    if (copy_count <= uVar13) {
      uVar13 = copy_count;
    }
    this_00 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
    pdVar8 = ColumnDataAllocator::GetDataPointer
                       (this_00,&state->current_chunk_state,pvVar7->block_id,pvVar7->offset);
    local_50.validity_mask = (unsigned_long *)(pdVar8 + 0x8000);
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.capacity = 0x800;
    if (pvVar7->count == 0) {
      TemplatedValidityMask<unsigned_long>::SetAllValid(&local_50,0x800);
    }
    if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pSVar3 = source_data->sel;
      pdVar4 = source_data->data;
      uVar1 = pvVar7->count;
      iVar9 = local_a0;
      for (lVar10 = 0; uVar13 << 4 != lVar10; lVar10 = lVar10 + 0x10) {
        psVar2 = pSVar3->sel_vector;
        iVar11 = iVar9;
        if (psVar2 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar2[iVar9];
        }
        uVar5 = *(undefined8 *)(pdVar4 + iVar11 * 0x10 + 8);
        *(undefined8 *)(pdVar8 + lVar10 + (ulong)uVar1 * 0x10) =
             *(undefined8 *)(pdVar4 + iVar11 * 0x10);
        *(undefined8 *)(pdVar8 + lVar10 + (ulong)uVar1 * 0x10 + 8) = uVar5;
        iVar9 = iVar9 + 1;
      }
    }
    else {
      for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        psVar2 = source_data->sel->sel_vector;
        if (psVar2 == (sel_t *)0x0) {
          iVar9 = local_a0 + uVar12;
        }
        else {
          iVar9 = (idx_t)psVar2[local_a0 + uVar12];
        }
        bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(source_data->validity).super_TemplatedValidityMask<unsigned_long>,iVar9
                          );
        if (bVar6) {
          uVar1 = pvVar7->count;
          uVar5 = *(undefined8 *)(source_data->data + iVar9 * 0x10 + 8);
          *(undefined8 *)(pdVar8 + (ulong)uVar1 * 0x10) =
               *(undefined8 *)(source_data->data + iVar9 * 0x10);
          *(undefined8 *)(pdVar8 + (ulong)uVar1 * 0x10 + 8) = uVar5;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid(&local_50,pvVar7->count + uVar12);
        }
        pdVar8 = pdVar8 + 0x10;
      }
    }
    pvVar7->count = pvVar7->count + (short)uVar13;
    copy_count = copy_count - uVar13;
    if (copy_count != 0) {
      if ((pvVar7->next_data).index == 0xffffffffffffffff) {
        ColumnDataCollectionSegment::AllocateVector
                  (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index);
      }
      pvVar7 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
      prev_index.index = (pvVar7->next_data).index;
    }
    local_a0 = local_a0 + uVar13;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

static void ColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                           idx_t offset, idx_t copy_count) {
	TemplatedColumnDataCopy<StandardValueCopy<T>>(meta_data, source_data, source, offset, copy_count);
}